

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

SurfaceInteraction *
pbrt::BilinearPatch::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,BilinearPatchMesh *mesh,int patchIndex,
          Point2f uv,Float time,Vector3f *wo)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  Point2f PVar11;
  Point2f PVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  bool bVar18;
  int *piVar19;
  Point3f *pPVar20;
  Point2f *pPVar21;
  Normal3f *pNVar22;
  float __x;
  ulong uVar23;
  undefined8 uVar24;
  bool bVar25;
  Point3fi pi;
  Normal3f dndu;
  Normal3f dndv;
  Normal3f dndvs;
  SurfaceInteraction *this;
  int iVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  Float sinTheta;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_register_00001208 [56];
  undefined1 extraout_var [60];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  Vector3f dpdu;
  Vector3f dpdv;
  Vector3f axis;
  Vector3f dpdus;
  Normal3f ns;
  Vector3f dpdvs;
  Normal3f dndus;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  Tuple2<pbrt::Point2,_float> local_258;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  float va;
  undefined4 uStack_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  float local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  int *local_108;
  SurfaceInteraction *local_100;
  Tuple3<pbrt::Vector3,_float> local_f8;
  Tuple3<pbrt::Point3,_float> local_e8;
  undefined1 local_d8 [16];
  double vb;
  float local_c0;
  Float local_b8;
  float local_b4;
  Float local_b0;
  Float local_a8;
  float local_a4;
  Float local_a0;
  Point3fi local_48;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar82._8_56_ = in_register_00001208;
  auVar82._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  local_1a8 = auVar82._0_16_;
  auVar41 = vshufps_avx(local_1a8,local_1a8,0xe1);
  piVar19 = mesh->vertexIndices;
  pPVar20 = mesh->p;
  lVar27 = (long)(patchIndex * 4);
  auVar28 = vbroadcastss_avx512vl
                      (ZEXT416((uint)pPVar20[piVar19[lVar27]].super_Tuple3<pbrt::Point3,_float>.z));
  fVar45 = pPVar20[piVar19[lVar27 + 1]].super_Tuple3<pbrt::Point3,_float>.z;
  fVar1 = pPVar20[piVar19[lVar27 + 2]].super_Tuple3<pbrt::Point3,_float>.z;
  uVar7._0_4_ = pPVar20[piVar19[lVar27]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar7._4_4_ = pPVar20[piVar19[lVar27]].super_Tuple3<pbrt::Point3,_float>.y;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar7;
  uVar8._0_4_ = pPVar20[piVar19[lVar27 + 1]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar8._4_4_ = pPVar20[piVar19[lVar27 + 1]].super_Tuple3<pbrt::Point3,_float>.y;
  auVar29 = vbroadcastss_avx512vl
                      (ZEXT416((uint)pPVar20[piVar19[lVar27 + 3]].super_Tuple3<pbrt::Point3,_float>.
                                     z));
  auVar38._8_4_ = 0x3f800000;
  auVar38._0_8_ = 0x3f8000003f800000;
  auVar38._12_4_ = 0x3f800000;
  uVar9._0_4_ = pPVar20[piVar19[lVar27 + 2]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar9._4_4_ = pPVar20[piVar19[lVar27 + 2]].super_Tuple3<pbrt::Point3,_float>.y;
  uVar10._0_4_ = pPVar20[piVar19[lVar27 + 3]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar10._4_4_ = pPVar20[piVar19[lVar27 + 3]].super_Tuple3<pbrt::Point3,_float>.y;
  local_1c8 = vsubps_avx(auVar38,local_1a8);
  auVar34 = vshufps_avx(local_1c8,local_1c8,0xe1);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar7;
  auVar30 = vmulps_avx512vl(auVar34,auVar92);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar8;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar9;
  auVar37 = vinsertps_avx512f(auVar88,auVar86,0x50);
  auVar40._0_4_ = auVar30._0_4_ + auVar37._0_4_ * auVar41._0_4_;
  auVar40._4_4_ = auVar30._4_4_ + auVar37._4_4_ * auVar41._4_4_;
  auVar40._8_4_ = auVar30._8_4_ + auVar37._8_4_ * auVar41._8_4_;
  auVar40._12_4_ = auVar30._12_4_ + auVar37._12_4_ * auVar41._12_4_;
  auVar31 = vmulps_avx512vl(local_1c8,auVar92);
  auVar30 = vinsertps_avx512f(auVar86,auVar88,0x50);
  local_1f8._4_4_ = uv.super_Tuple2<pbrt::Point2,_float>.x;
  auVar32._0_4_ = auVar31._0_4_ + auVar30._0_4_ * (float)local_1f8._4_4_;
  auVar32._4_4_ = auVar31._4_4_ + auVar30._4_4_ * uv.super_Tuple2<pbrt::Point2,_float>.y;
  auVar32._8_4_ = auVar31._8_4_ + auVar30._8_4_ * in_register_00001208._0_4_;
  auVar32._12_4_ = auVar31._12_4_ + auVar30._12_4_ * in_register_00001208._4_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar10;
  auVar31 = vmulps_avx512vl(auVar41,auVar90);
  auVar33._0_4_ = auVar34._0_4_ * auVar30._0_4_ + auVar31._0_4_;
  auVar33._4_4_ = auVar34._4_4_ * auVar30._4_4_ + auVar31._4_4_;
  auVar33._8_4_ = auVar34._8_4_ * auVar30._8_4_ + auVar31._8_4_;
  auVar33._12_4_ = auVar34._12_4_ * auVar30._12_4_ + auVar31._12_4_;
  local_1b8._4_4_ = local_1c8._0_4_;
  auVar30 = vmulps_avx512vl(auVar90,local_1a8);
  auVar39._0_4_ = (float)local_1b8._4_4_ * auVar37._0_4_ + auVar30._0_4_;
  auVar39._4_4_ = local_1c8._4_4_ * auVar37._4_4_ + auVar30._4_4_;
  auVar39._8_4_ = local_1c8._8_4_ * auVar37._8_4_ + auVar30._8_4_;
  auVar39._12_4_ = local_1c8._12_4_ * auVar37._12_4_ + auVar30._12_4_;
  auVar37 = vblendps_avx(auVar40,auVar32,2);
  auVar30 = vblendps_avx(auVar33,auVar39,2);
  auVar31._0_4_ = (float)local_1f8._4_4_ * auVar30._0_4_ + (float)local_1b8._4_4_ * auVar37._0_4_;
  auVar31._4_4_ = (float)local_1f8._4_4_ * auVar30._4_4_ + (float)local_1b8._4_4_ * auVar37._4_4_;
  auVar31._8_4_ = (float)local_1f8._4_4_ * auVar30._8_4_ + (float)local_1b8._4_4_ * auVar37._8_4_;
  auVar31._12_4_ = (float)local_1f8._4_4_ * auVar30._12_4_ + (float)local_1b8._4_4_ * auVar37._12_4_
  ;
  local_e8._0_8_ = vmovlps_avx(auVar31);
  auVar30 = vsubps_avx(auVar33,auVar40);
  auVar31 = vsubps_avx(auVar39,auVar32);
  _local_268 = vblendps_avx(auVar30,auVar31,2);
  auVar32 = vmulps_avx512vl(auVar41,auVar29);
  auVar37 = vinsertps_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar45),0x10);
  auVar33 = vmulps_avx512vl(auVar34,auVar28);
  auVar35._0_4_ = auVar33._0_4_ + auVar41._0_4_ * auVar37._0_4_;
  auVar35._4_4_ = auVar33._4_4_ + auVar41._4_4_ * auVar37._4_4_;
  auVar35._8_4_ = auVar33._8_4_ + auVar41._8_4_ * auVar37._8_4_;
  auVar35._12_4_ = auVar33._12_4_ + auVar41._12_4_ * auVar37._12_4_;
  auVar37 = vinsertps_avx512f(ZEXT416((uint)fVar45),ZEXT416((uint)fVar1),0x10);
  auVar41._0_4_ = auVar34._0_4_ * auVar37._0_4_ + auVar32._0_4_;
  auVar41._4_4_ = auVar34._4_4_ * auVar37._4_4_ + auVar32._4_4_;
  auVar41._8_4_ = auVar34._8_4_ * auVar37._8_4_ + auVar32._8_4_;
  auVar41._12_4_ = auVar34._12_4_ * auVar37._12_4_ + auVar32._12_4_;
  local_e8.z = (float)local_1b8._4_4_ * auVar35._0_4_ + auVar41._0_4_ * (float)local_1f8._4_4_;
  auVar41 = vsubps_avx(auVar41,auVar35);
  auVar83 = ZEXT1664(auVar41);
  auVar37 = vmovshdup_avx(auVar41);
  auVar82 = ZEXT1664(auVar37);
  _local_248 = vblendps_avx(auVar31,auVar30,2);
  pPVar21 = mesh->uv;
  _local_148 = vmovshdup_avx512vl(local_1c8);
  local_158 = vmovshdup_avx512vl(local_1a8);
  local_1b8._0_4_ = local_1b8._4_4_;
  fStack_1b0 = (float)local_1b8._4_4_;
  fStack_1ac = (float)local_1b8._4_4_;
  local_1f8._0_4_ = local_1f8._4_4_;
  fStack_1f0 = (float)local_1f8._4_4_;
  fStack_1ec = (float)local_1f8._4_4_;
  local_100 = __return_storage_ptr__;
  local_258 = uv.super_Tuple2<pbrt::Point2,_float>;
  if (pPVar21 != (Point2f *)0x0) {
    PVar11.super_Tuple2<pbrt::Point2,_float> =
         pPVar21[piVar19[lVar27]].super_Tuple2<pbrt::Point2,_float>;
    auVar61._8_8_ = 0;
    auVar61._0_4_ = PVar11.super_Tuple2<pbrt::Point2,_float>.x;
    auVar61._4_4_ = PVar11.super_Tuple2<pbrt::Point2,_float>.y;
    auVar34 = vmulps_avx512vl(_local_148,auVar61);
    auVar68._8_8_ = 0;
    auVar68._0_4_ = pPVar21[piVar19[lVar27 + 2]].super_Tuple2<pbrt::Point2,_float>.x;
    auVar68._4_4_ = pPVar21[piVar19[lVar27 + 2]].super_Tuple2<pbrt::Point2,_float>.y;
    auVar32 = vmulps_avx512vl(local_158,auVar68);
    auVar72._8_8_ = 0;
    auVar72._0_4_ = pPVar21[piVar19[lVar27 + 1]].super_Tuple2<pbrt::Point2,_float>.x;
    auVar72._4_4_ = pPVar21[piVar19[lVar27 + 1]].super_Tuple2<pbrt::Point2,_float>.y;
    auVar33 = vmulps_avx512vl(_local_148,auVar72);
    PVar12.super_Tuple2<pbrt::Point2,_float> =
         pPVar21[piVar19[lVar27 + 3]].super_Tuple2<pbrt::Point2,_float>;
    auVar75._8_8_ = 0;
    auVar75._0_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.x;
    auVar75._4_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.y;
    auVar35 = vmulps_avx512vl(local_158,auVar75);
    local_258.y = (float)local_1b8._4_4_ * (auVar34._4_4_ + auVar32._4_4_) +
                  (float)local_1f8._4_4_ * (auVar35._4_4_ + auVar33._4_4_);
    local_258.x = (float)local_1b8._4_4_ * (auVar34._0_4_ + auVar32._0_4_) +
                  (float)local_1f8._4_4_ * (auVar35._0_4_ + auVar33._0_4_);
    auVar34 = vsubps_avx(auVar61,auVar68);
    auVar34 = vsubps_avx(auVar34,auVar72);
    auVar74._0_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.x + auVar34._0_4_;
    auVar74._4_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.y + auVar34._4_4_;
    auVar74._8_4_ = auVar34._8_4_ + 0.0;
    auVar74._12_4_ = auVar34._12_4_ + 0.0;
    auVar34 = vinsertps_avx(auVar72,auVar68,0x4c);
    auVar32 = vmovshdup_avx(auVar61);
    auVar32 = vsubps_avx(auVar34,auVar32);
    auVar34 = vmovshdup_avx(auVar74);
    auVar32 = vfmadd213ps_fma(auVar34,local_1a8,auVar32);
    auVar77._8_4_ = 0x322bcc77;
    auVar77._0_8_ = 0x322bcc77322bcc77;
    auVar77._12_4_ = 0x322bcc77;
    auVar80._8_4_ = 0x7fffffff;
    auVar80._0_8_ = 0x7fffffff7fffffff;
    auVar80._12_4_ = 0x7fffffff;
    auVar34 = vandps_avx(auVar32,auVar80);
    uVar23 = vcmpps_avx512vl(auVar34,auVar77,5);
    auVar34 = vdivps_avx512vl(auVar38,auVar32);
    fVar43 = (float)((uint)((byte)uVar23 & 1) * auVar34._0_4_);
    fVar60 = (float)((uint)((byte)(uVar23 >> 1) & 1) * auVar34._4_4_);
    auVar36._4_4_ = fVar60;
    auVar36._0_4_ = fVar43;
    fVar67 = (float)((uint)((byte)(uVar23 >> 2) & 1) * auVar34._8_4_);
    auVar36._8_4_ = fVar67;
    fVar44 = (float)((uint)((byte)(uVar23 >> 3) & 1) * auVar34._12_4_);
    auVar36._12_4_ = fVar44;
    auVar34 = vmovshdup_avx(auVar36);
    auVar32 = vshufps_avx(auVar36,auVar36,0xe1);
    auVar81._0_4_ = auVar31._0_4_ * fVar43 + auVar32._0_4_ * auVar30._0_4_;
    auVar81._4_4_ = auVar31._4_4_ * fVar60 + auVar32._4_4_ * auVar30._4_4_;
    auVar81._8_4_ = auVar31._8_4_ * fVar67 + auVar32._8_4_ * auVar30._8_4_;
    auVar81._12_4_ = auVar31._12_4_ * fVar44 + auVar32._12_4_ * auVar30._12_4_;
    auVar32 = vmovshdup_avx(auVar81);
    fVar76 = auVar41._0_4_ * auVar34._0_4_ + auVar37._0_4_ * fVar43;
    auVar37 = vinsertps_avx(auVar68,auVar72,0x1c);
    auVar62._0_4_ = PVar11.super_Tuple2<pbrt::Point2,_float>.x;
    auVar62._4_4_ = auVar62._0_4_;
    auVar62._8_4_ = auVar62._0_4_;
    auVar62._12_4_ = auVar62._0_4_;
    auVar37 = vsubps_avx(auVar37,auVar62);
    auVar69._4_4_ = auVar74._0_4_;
    auVar69._0_4_ = auVar74._0_4_;
    auVar69._8_4_ = auVar74._0_4_;
    auVar69._12_4_ = auVar74._0_4_;
    auVar34 = vfmadd213ps_fma(auVar69,local_1a8,auVar37);
    auVar37 = vandps_avx(auVar80,auVar34);
    uVar23 = vcmpps_avx512vl(auVar37,auVar77,5);
    auVar37 = vdivps_avx512vl(auVar38,auVar34);
    fVar60 = (float)((uint)((byte)uVar23 & 1) * auVar37._0_4_);
    fVar43 = (float)((uint)((byte)(uVar23 >> 1) & 1) * auVar37._4_4_);
    auVar34._4_4_ = fVar43;
    auVar34._0_4_ = fVar60;
    fVar67 = (float)((uint)((byte)(uVar23 >> 2) & 1) * auVar37._8_4_);
    auVar34._8_4_ = fVar67;
    fVar44 = (float)((uint)((byte)(uVar23 >> 3) & 1) * auVar37._12_4_);
    auVar34._12_4_ = fVar44;
    auVar37 = vinsertps_avx(auVar31,auVar41,0x1c);
    auVar63._0_4_ = auVar37._0_4_ * fVar60;
    auVar63._4_4_ = auVar37._4_4_ * fVar43;
    auVar63._8_4_ = auVar37._8_4_ * fVar67;
    auVar63._12_4_ = auVar37._12_4_ * fVar44;
    auVar37 = vinsertps_avx(auVar31,auVar30,0x4c);
    auVar70._0_4_ = auVar37._0_4_ * fVar60;
    auVar70._4_4_ = auVar37._4_4_ * fVar43;
    auVar70._8_4_ = auVar37._8_4_ * fVar67;
    auVar70._12_4_ = auVar37._12_4_ * fVar44;
    auVar33 = vshufps_avx(auVar34,auVar34,0xe1);
    auVar34 = vinsertps_avx(auVar41,auVar30,0xc);
    auVar37 = vhaddps_avx(auVar70,auVar70);
    auVar56._0_4_ = auVar34._0_4_ * auVar33._0_4_;
    auVar56._4_4_ = auVar34._4_4_ * auVar33._4_4_;
    auVar56._8_4_ = auVar34._8_4_ * auVar33._8_4_;
    auVar56._12_4_ = auVar34._12_4_ * auVar33._12_4_;
    auVar38 = vaddps_avx512vl(auVar63,auVar56);
    local_198 = vmovshdup_avx512vl(auVar38);
    auVar33 = vmulss_avx512f(local_198,auVar32);
    auVar34 = vfmsub213ss_fma(ZEXT416((uint)fVar76),auVar37,auVar33);
    auVar64._8_4_ = 0x80000000;
    auVar64._0_8_ = 0x8000000080000000;
    auVar64._12_4_ = 0x80000000;
    auVar33 = vfnmadd231ss_avx512f(auVar33,local_198,auVar32);
    fVar60 = auVar34._0_4_ + auVar33._0_4_;
    auVar33 = vmulss_avx512f(auVar38,ZEXT416((uint)fVar76));
    auVar35 = vfmsub213ss_avx512f(auVar81,local_198,auVar33);
    auVar34 = vinsertps_avx512f(auVar37,auVar38,0x10);
    auVar39 = vxorps_avx512vl(auVar34,auVar64);
    auVar40 = vshufps_avx512vl(auVar39,auVar39,0xf5);
    auVar33 = vfmadd213ss_fma(auVar40,ZEXT416((uint)fVar76),auVar33);
    fVar43 = auVar35._0_4_ + auVar33._0_4_;
    auVar35 = ZEXT416((uint)(auVar81._0_4_ * auVar37._0_4_));
    auVar33 = vfmsub213ss_avx512f(auVar32,auVar38,auVar35);
    auVar32 = vfnmadd231ss_fma(auVar35,auVar37,auVar81);
    fVar67 = auVar33._0_4_ + auVar32._0_4_;
    if ((((fVar67 != 0.0) || (NAN(fVar67))) || (fVar60 != 0.0)) ||
       (((NAN(fVar60) || (fVar43 != 0.0)) || (NAN(fVar43))))) {
      auVar33 = vxorps_avx512vl(local_198,auVar64);
      auVar42 = vmovshdup_avx(auVar31);
      auVar32 = vmovshdup_avx(auVar30);
      auVar35 = ZEXT416((uint)(auVar31._0_4_ * auVar42._0_4_));
      auVar32 = vfmsub213ss_fma(auVar32,auVar30,auVar35);
      auVar42 = vfnmadd213ss_fma(auVar42,auVar31,auVar35);
      auVar32 = vaddss_avx512f(auVar32,auVar42);
      auVar42 = vshufps_avx(auVar41,auVar41,0xe1);
      auVar78._0_4_ = auVar42._0_4_ * auVar30._0_4_;
      auVar78._4_4_ = auVar42._4_4_ * auVar30._4_4_;
      auVar78._8_4_ = auVar42._8_4_ * auVar30._8_4_;
      auVar78._12_4_ = auVar42._12_4_ * auVar30._12_4_;
      auVar42 = vfmsub213ps_fma(auVar31,auVar41,auVar78);
      auVar31 = vinsertps_avx(auVar30,auVar41,0x1c);
      auVar30 = vinsertps_avx(auVar30,auVar41,0x4c);
      auVar30 = vfnmadd213ps_fma(auVar30,auVar31,auVar78);
      auVar79._0_4_ = auVar42._0_4_ + auVar30._0_4_;
      auVar79._4_4_ = auVar42._4_4_ + auVar30._4_4_;
      auVar79._8_4_ = auVar42._8_4_ + auVar30._8_4_;
      auVar79._12_4_ = auVar42._12_4_ + auVar30._12_4_;
      auVar30 = vmovshdup_avx(auVar79);
      auVar41 = vfmadd213ss_fma(ZEXT416((uint)fVar60),auVar30,
                                ZEXT416((uint)(auVar79._0_4_ * fVar43)));
      auVar41 = vfmadd213ss_avx512f(ZEXT416((uint)fVar67),auVar32,auVar41);
      if (auVar41._0_4_ < 0.0) {
        uVar23 = CONCAT44(auVar81._4_4_,auVar81._0_4_);
        auVar81._0_8_ = uVar23 ^ 0x8000000080000000;
        auVar81._8_4_ = -auVar81._8_4_;
        auVar81._12_4_ = -auVar81._12_4_;
      }
      uVar24 = vcmpss_avx512f(auVar41,ZEXT816(0) << 0x20,1);
      bVar25 = (bool)((byte)uVar24 & 1);
      auVar46._0_4_ = auVar79._0_4_ * auVar79._0_4_;
      auVar46._4_4_ = auVar79._4_4_ * auVar79._4_4_;
      auVar46._8_4_ = auVar79._8_4_ * auVar79._8_4_;
      auVar46._12_4_ = auVar79._12_4_ * auVar79._12_4_;
      auVar41 = vhaddps_avx(auVar46,auVar46);
      local_188 = ZEXT416((uint)bVar25 * (int)-fVar76 + (uint)!bVar25 * (int)fVar76);
      auVar31 = vmulss_avx512f(auVar32,auVar32);
      fVar60 = auVar31._0_4_ + auVar41._0_4_;
      local_128._8_8_ = 0;
      local_128._0_8_ = uVar7;
      if (fVar60 < 0.0) {
        local_168._0_4_ = auVar32._0_4_;
        local_178 = auVar79;
        local_118 = auVar30;
        auVar83._0_4_ = sqrtf(fVar60);
        auVar83._4_60_ = extraout_var;
        auVar41 = auVar83._0_16_;
        auVar32 = ZEXT416((uint)local_168._0_4_);
        auVar79 = local_178;
        auVar30 = local_118;
      }
      else {
        auVar41 = vsqrtss_avx(ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
      }
      auVar73._0_4_ = auVar30._0_4_ / auVar41._0_4_;
      auVar73._4_12_ = auVar30._4_12_;
      auVar32 = vdivss_avx512f(auVar32,auVar41);
      auVar31 = vshufps_avx(auVar81,auVar81,0xe1);
      auVar30 = vmovshdup_avx(auVar81);
      auVar35 = vmulss_avx512f(local_198,auVar30);
      auVar42 = vfmsub213ss_fma(local_188,auVar37,auVar35);
      auVar30 = vfmadd213ss_fma(auVar33,auVar30,auVar35);
      fVar60 = auVar30._0_4_ + auVar42._0_4_;
      auVar30 = vinsertps_avx(auVar81,local_188,0x10);
      auVar34 = vmulps_avx512vl(auVar34,auVar30);
      auVar31 = vfmsub213ps_avx512vl(auVar31,auVar38,auVar34);
      auVar30 = vfmadd213ps_avx512vl(auVar39,auVar30,auVar34);
      auVar34 = vaddps_avx512vl(auVar31,auVar30);
      auVar47._0_4_ = auVar34._0_4_ * auVar34._0_4_;
      auVar47._4_4_ = auVar34._4_4_ * auVar34._4_4_;
      auVar47._8_4_ = auVar34._8_4_ * auVar34._8_4_;
      auVar47._12_4_ = auVar34._12_4_ * auVar34._12_4_;
      auVar30 = vmovshdup_avx(auVar47);
      fVar43 = auVar47._0_4_ + auVar30._0_4_ + fVar60 * fVar60;
      if (fVar43 < 0.0) {
        local_168._0_4_ = fVar60;
        local_178 = auVar34;
        fVar43 = sqrtf(fVar43);
        auVar73 = ZEXT416((uint)auVar73._0_4_);
        auVar32 = ZEXT416(auVar32._0_4_);
        fVar60 = (float)local_168._0_4_;
        auVar34 = local_178;
      }
      else {
        auVar30 = vsqrtss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43));
        fVar43 = auVar30._0_4_;
      }
      auVar82 = ZEXT1664(local_188);
      auVar30 = vmovshdup_avx(auVar34);
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)((auVar79._0_4_ / auVar41._0_4_) *
                                              (auVar30._0_4_ / fVar43))),auVar73,
                                ZEXT416((uint)(fVar60 / fVar43)));
      auVar48._0_4_ = auVar34._0_4_ / fVar43;
      auVar48._4_12_ = auVar34._4_12_;
      auVar30 = vfmadd213ss_fma(auVar48,auVar32,auVar30);
      _va = CONCAT44(uStack_1dc,auVar30._0_4_);
      vb = -0.001;
      if (auVar30._0_4_ < -0.001) {
        LogFatal<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.h"
                   ,0x589,"Check failed: %s >= %s with %s = %s, %s = %s",
                   (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                   (char (*) [6])"-1e-3",
                   (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                   &va,(char (*) [6])"-1e-3",&vb);
      }
      _local_268 = vinsertps_avx512f(auVar38,auVar37,0x1c);
      auVar83 = ZEXT1664(local_198);
      auVar42 = local_128;
      _local_248 = auVar81;
    }
  }
  auVar35 = _local_248;
  auVar38 = _local_268;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar10;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar8;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar9;
  auVar37 = vsubps_avx512vl(auVar42,auVar89);
  auVar37 = vsubps_avx512vl(auVar37,auVar87);
  auVar33 = vaddps_avx512vl(auVar37,auVar91);
  auVar37 = vmovshdup_avx(auVar33);
  auVar30 = vsubss_avx512f(auVar28,ZEXT416((uint)fVar1));
  auVar30 = vsubss_avx512f(auVar30,ZEXT416((uint)fVar45));
  auVar39 = vaddss_avx512f(auVar30,auVar29);
  local_178 = vmovshdup_avx(_local_268);
  fVar67 = local_178._0_4_;
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * fVar67)),_local_268,_local_268);
  local_198 = auVar83._0_16_;
  auVar30 = vfmadd231ss_fma(auVar30,local_198,local_198);
  local_168 = vmovshdup_avx(_local_248);
  fVar60 = local_168._0_4_;
  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar67)),_local_268,_local_248);
  local_188 = auVar82._0_16_;
  auVar41 = vfmadd231ss_fma(auVar41,local_198,local_188);
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar60)),_local_248,_local_248);
  auVar34 = vfmadd231ss_fma(auVar34,local_188,local_188);
  auVar32 = ZEXT416((uint)(auVar83._0_4_ * fVar60));
  auVar31 = vfmsub213ss_fma(local_188,local_178,auVar32);
  auVar32 = vfnmadd231ss_fma(auVar32,local_198,local_168);
  fVar60 = auVar31._0_4_ + auVar32._0_4_;
  fVar76 = local_268._0_4_;
  auVar32 = ZEXT416((uint)(auVar82._0_4_ * fVar76));
  auVar31 = vfmsub213ss_fma(_local_248,local_198,auVar32);
  auVar32 = vfnmadd231ss_fma(auVar32,_local_268,local_188);
  fVar43 = auVar31._0_4_ + auVar32._0_4_;
  fVar58 = local_248._0_4_;
  auVar31 = vfmsub213ss_fma(local_168,_local_268,ZEXT416((uint)(fVar58 * fVar67)));
  auVar32 = vfnmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar67)),local_178,_local_248);
  fVar67 = auVar31._0_4_ + auVar32._0_4_;
  fVar44 = fVar67 * fVar67 + fVar60 * fVar60 + fVar43 * fVar43;
  local_108 = piVar19;
  if (fVar44 < 0.0) {
    local_1d4 = fVar67;
    local_1d0 = fVar43;
    local_1cc = fVar60;
    local_128 = auVar42;
    local_118 = auVar33;
    local_d8 = auVar37;
    fVar44 = sqrtf(fVar44);
    auVar34 = ZEXT416(auVar34._0_4_);
    auVar41 = ZEXT416(auVar41._0_4_);
    auVar30 = ZEXT416(auVar30._0_4_);
    auVar39 = ZEXT416(auVar39._0_4_);
    auVar83 = ZEXT1664(local_198);
    auVar82 = ZEXT1664(local_188);
    fVar67 = local_1d4;
    fVar60 = local_1cc;
    fVar43 = local_1d0;
    auVar42 = local_128;
    auVar33 = local_118;
    auVar37 = local_d8;
  }
  else {
    auVar31 = vsqrtss_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44));
    fVar44 = auVar31._0_4_;
  }
  auVar40 = ZEXT816(0) << 0x40;
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)((fVar43 / fVar44) * 0.0)),
                            ZEXT416((uint)(fVar60 / fVar44)),auVar40);
  auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)(fVar67 / fVar44)),auVar40);
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar37._0_4_ * (fVar43 / fVar44))),auVar33,
                            ZEXT416((uint)(fVar60 / fVar44)));
  auVar37 = vfmadd213ss_fma(auVar39,ZEXT416((uint)(fVar67 / fVar44)),auVar37);
  auVar33 = ZEXT416((uint)(auVar41._0_4_ * auVar41._0_4_));
  auVar32 = vfmsub213ss_fma(auVar34,auVar30,auVar33);
  auVar33 = vfnmadd231ss_fma(auVar33,auVar41,auVar41);
  fVar60 = auVar32._0_4_ + auVar33._0_4_;
  uVar24 = vcmpss_avx512f(ZEXT416((uint)fVar60),auVar40,0);
  fVar67 = (float)((uint)!(bool)((byte)uVar24 & 1) * (int)(1.0 / fVar60));
  auVar32 = vfmsub231ss_fma(ZEXT416((uint)(auVar34._0_4_ * auVar31._0_4_)),auVar37,auVar41);
  fVar60 = fVar67 * auVar32._0_4_;
  auVar32 = vfmsub231ss_fma(ZEXT416((uint)(auVar30._0_4_ * auVar37._0_4_)),auVar31,auVar41);
  fVar43 = fVar67 * auVar32._0_4_;
  local_2b8._4_4_ = (float)local_268._4_4_ * fVar60 + (float)local_248._4_4_ * fVar43;
  local_2b8._0_4_ = fVar76 * fVar60 + fVar58 * fVar43;
  fStack_2b0 = fStack_260 * fVar60 + fStack_240 * fVar43;
  fStack_2ac = fStack_25c * fVar60 + fStack_23c * fVar43;
  fVar60 = auVar83._0_4_ * fVar60 + auVar82._0_4_ * fVar43;
  auVar34 = vfmsub231ss_fma(ZEXT416((uint)(auVar34._0_4_ * auVar37._0_4_)),auVar31,auVar41);
  fVar43 = fVar67 * auVar34._0_4_;
  auVar37 = vfmsub231ss_fma(ZEXT416((uint)(auVar30._0_4_ * auVar31._0_4_)),auVar41,auVar37);
  fVar67 = fVar67 * auVar37._0_4_;
  local_2d8._4_4_ = (float)local_268._4_4_ * fVar43 + (float)local_248._4_4_ * fVar67;
  local_2d8._0_4_ = fVar76 * fVar43 + fVar58 * fVar67;
  fStack_2d0 = fStack_260 * fVar43 + fStack_240 * fVar67;
  fStack_2cc = fStack_25c * fVar43 + fStack_23c * fVar67;
  fVar43 = auVar83._0_4_ * fVar43 + auVar82._0_4_ * fVar67;
  auVar49._8_4_ = 0x7fffffff;
  auVar49._0_8_ = 0x7fffffff7fffffff;
  auVar49._12_4_ = 0x7fffffff;
  auVar30 = vandps_avx512vl(auVar42,auVar49);
  auVar37 = vinsertps_avx512f(auVar28,ZEXT416((uint)fVar1),0x10);
  auVar37 = vandps_avx(auVar37,auVar49);
  auVar41 = vandps_avx512vl(auVar87,auVar49);
  auVar41 = vmaxps_avx(auVar41,auVar30);
  auVar30 = vinsertps_avx512f(ZEXT416((uint)fVar45),auVar29,0x10);
  auVar30 = vandps_avx(auVar30,auVar49);
  auVar37 = vmaxps_avx(auVar30,auVar37);
  auVar30 = vandps_avx512vl(auVar89,auVar49);
  auVar34 = vandps_avx512vl(auVar91,auVar49);
  auVar30 = vmaxps_avx(auVar34,auVar30);
  auVar30 = vmaxps_avx(auVar30,auVar41);
  auVar41 = vmovshdup_avx(auVar37);
  auVar37 = vmaxss_avx(auVar41,auVar37);
  auVar28._8_4_ = 0x34800002;
  auVar28._0_8_ = 0x3480000234800002;
  auVar28._12_4_ = 0x34800002;
  auVar30 = vmulps_avx512vl(auVar30,auVar28);
  local_f8.z = auVar37._0_4_ * 2.3841864e-07;
  local_f8._0_8_ = vmovlps_avx(auVar30);
  if (mesh->faceIndices == (int *)0x0) {
    iVar26 = 0;
  }
  else {
    iVar26 = mesh->faceIndices[patchIndex];
  }
  bVar25 = mesh->reverseOrientation;
  bVar18 = mesh->transformSwapsHandedness;
  Point3fi::Point3fi(&local_48,(Point3f *)&local_e8,(Vector3f *)&local_f8);
  this = local_100;
  vb = (double)vmovlps_avx(_local_2d8);
  _va = vmovlps_avx(_local_2b8);
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dndu.super_Tuple3<pbrt::Normal3,_float>.z = fVar60;
  dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)_va;
  dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)_va >> 0x20);
  dndv.super_Tuple3<pbrt::Normal3,_float>.z = fVar43;
  dndv.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vb;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_198._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_268._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_268._4_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_188._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_248._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_248._4_4_;
  local_1d8 = fVar60;
  local_c0 = fVar43;
  SurfaceInteraction::SurfaceInteraction
            (local_100,pi,(Point2f)local_258,(Vector3f)wo->super_Tuple3<pbrt::Vector3,_float>,dpdu,
             dpdv,dndu,dndv,time,bVar25 != bVar18);
  this->faceIndex = iVar26;
  pNVar22 = mesh->n;
  if (pNVar22 != (Normal3f *)0x0) {
    fVar45 = pNVar22[local_108[lVar27]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar1 = pNVar22[local_108[lVar27 + 1]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar60 = pNVar22[local_108[lVar27 + 2]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar43 = pNVar22[local_108[lVar27 + 3]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar76 = local_148._0_4_;
    fVar67 = fVar45 * fVar76 + fVar60 * local_158._0_4_;
    fVar44 = fVar1 * fVar76 + fVar43 * local_158._0_4_;
    uVar2 = pNVar22[local_108[lVar27]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar13 = pNVar22[local_108[lVar27]].super_Tuple3<pbrt::Normal3,_float>.y;
    local_2a8._4_4_ = uVar13;
    local_2a8._0_4_ = uVar2;
    uVar3 = pNVar22[local_108[lVar27 + 1]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar14 = pNVar22[local_108[lVar27 + 1]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar29._4_4_ = uVar14;
    auVar29._0_4_ = uVar3;
    uVar4 = pNVar22[local_108[lVar27 + 2]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar15 = pNVar22[local_108[lVar27 + 2]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar84._4_4_ = uVar15;
    auVar84._0_4_ = uVar4;
    uVar5 = pNVar22[local_108[lVar27 + 3]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar16 = pNVar22[local_108[lVar27 + 3]].super_Tuple3<pbrt::Normal3,_float>.y;
    auVar85._4_4_ = uVar16;
    auVar85._0_4_ = uVar5;
    auVar84._8_8_ = 0;
    auVar37 = vmulps_avx512vl(local_158,auVar84);
    local_2c8._0_4_ = (float)uVar2 * fVar76 + auVar37._0_4_;
    local_2c8._4_4_ = (float)uVar13 * local_148._4_4_ + auVar37._4_4_;
    fStack_2c0 = local_148._8_4_ * 0.0 + auVar37._8_4_;
    fStack_2bc = local_148._12_4_ * 0.0 + auVar37._12_4_;
    auVar29._8_8_ = 0;
    auVar37 = vmulps_avx512vl(_local_148,auVar29);
    auVar85._8_8_ = 0;
    auVar30 = vmulps_avx512vl(local_158,auVar85);
    local_2d8._0_4_ = auVar37._0_4_ + auVar30._0_4_;
    local_2d8._4_4_ = auVar37._4_4_ + auVar30._4_4_;
    fStack_2d0 = auVar37._8_4_ + auVar30._8_4_;
    fStack_2cc = auVar37._12_4_ + auVar30._12_4_;
    local_148._0_4_ =
         (float)local_2c8._0_4_ * (float)local_1b8._0_4_ +
         (float)local_1f8._4_4_ * (float)local_2d8._0_4_;
    local_148._4_4_ =
         (float)local_2c8._4_4_ * (float)local_1b8._4_4_ +
         (float)local_1f8._4_4_ * (float)local_2d8._4_4_;
    fStack_140 = fStack_2c0 * fStack_1b0 + (float)local_1f8._4_4_ * fStack_2d0;
    fStack_13c = fStack_2bc * fStack_1ac + (float)local_1f8._4_4_ * fStack_2cc;
    auVar37._0_4_ = (float)local_148._0_4_ * (float)local_148._0_4_;
    auVar37._4_4_ = (float)local_148._4_4_ * (float)local_148._4_4_;
    auVar37._8_4_ = fStack_140 * fStack_140;
    auVar37._12_4_ = fStack_13c * fStack_13c;
    auVar37 = vhaddps_avx(auVar37,auVar37);
    fVar76 = fVar67 * (float)local_1c8._0_4_ + fVar44 * (float)local_1a8._0_4_;
    fVar58 = auVar37._0_4_ + fVar76 * fVar76;
    if (0.0 < fVar58) {
      local_2a8._8_8_ = 0;
      if (fVar58 < 0.0) {
        auVar52._0_4_ = sqrtf(fVar58);
        auVar52._4_60_ = extraout_var_00;
        auVar37 = auVar52._0_16_;
      }
      else {
        auVar37 = vsqrtss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
      }
      fVar76 = fVar76 / auVar37._0_4_;
      auVar41 = ZEXT416((uint)fVar76);
      fVar58 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar6 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
      uVar17 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar54._0_4_ = (float)uVar6 * (float)uVar6;
      auVar54._4_4_ = (float)uVar17 * (float)uVar17;
      auVar54._8_8_ = 0;
      auVar30 = vmovshdup_avx(auVar54);
      fVar58 = fVar58 * fVar58 + auVar54._0_4_ + auVar30._0_4_;
      if (fVar58 < 0.0) {
        local_158 = auVar37;
        auVar53._0_4_ = sqrtf(fVar58);
        auVar53._4_60_ = extraout_var_01;
        auVar30 = auVar53._0_16_;
        auVar37 = local_158;
      }
      else {
        auVar30 = vsqrtss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
      }
      auVar32 = vdivss_avx512f(ZEXT416((uint)(this->super_Interaction).n.
                                             super_Tuple3<pbrt::Normal3,_float>.x),auVar30);
      auVar33 = vdivss_avx512f(ZEXT416((uint)(this->super_Interaction).n.
                                             super_Tuple3<pbrt::Normal3,_float>.y),auVar30);
      auVar28 = vdivss_avx512f(ZEXT416((uint)(this->super_Interaction).n.
                                             super_Tuple3<pbrt::Normal3,_float>.z),auVar30);
      auVar50._8_4_ = 0x80000000;
      auVar50._0_8_ = 0x8000000080000000;
      auVar50._12_4_ = 0x80000000;
      auVar30 = vxorps_avx512vl(auVar28,auVar50);
      auVar39 = vmulss_avx512f(auVar41,auVar32);
      auVar59._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
      auVar59._8_4_ = auVar39._8_4_ ^ 0x80000000;
      auVar59._12_4_ = auVar39._12_4_ ^ 0x80000000;
      auVar40 = vxorps_avx512vl(auVar32,auVar50);
      auVar71._0_4_ = auVar37._0_4_;
      auVar71._4_4_ = auVar71._0_4_;
      auVar71._8_4_ = auVar71._0_4_;
      auVar71._12_4_ = auVar71._0_4_;
      auVar37 = vdivps_avx(_local_148,auVar71);
      auVar34 = vmovshdup_avx(auVar37);
      auVar42 = vmulss_avx512f(auVar34,auVar28);
      auVar51._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
      auVar51._8_4_ = auVar42._8_4_ ^ 0x80000000;
      auVar51._12_4_ = auVar42._12_4_ ^ 0x80000000;
      auVar31 = vinsertps_avx512f(auVar28,auVar30,0x10);
      auVar30 = vinsertps_avx(auVar59,auVar42,0x1c);
      auVar42 = vfmadd231ps_fma(auVar30,auVar37,auVar31);
      auVar31 = vinsertps_avx512f(auVar40,auVar33,0x1c);
      auVar65._4_4_ = fVar76;
      auVar65._0_4_ = fVar76;
      auVar65._8_4_ = fVar76;
      auVar65._12_4_ = fVar76;
      auVar30 = vinsertps_avx(auVar39,auVar51,0x10);
      auVar30 = vfmadd231ps_fma(auVar30,auVar31,auVar65);
      auVar66._0_4_ = auVar30._0_4_ + auVar42._0_4_;
      auVar66._4_4_ = auVar30._4_4_ + auVar42._4_4_;
      auVar66._8_4_ = auVar30._8_4_ + auVar42._8_4_;
      auVar66._12_4_ = auVar30._12_4_ + auVar42._12_4_;
      auVar31 = vmulss_avx512f(auVar37,auVar33);
      auVar42 = vfmsub213ss_avx512f(auVar34,auVar32,auVar31);
      auVar30._0_4_ = auVar66._0_4_ * auVar66._0_4_;
      auVar30._4_4_ = auVar66._4_4_ * auVar66._4_4_;
      auVar30._8_4_ = auVar66._8_4_ * auVar66._8_4_;
      auVar30._12_4_ = auVar66._12_4_ * auVar66._12_4_;
      auVar30 = vhaddps_avx(auVar30,auVar30);
      auVar31 = vfnmadd231ss_avx512f(auVar31,auVar33,auVar37);
      fVar58 = auVar42._0_4_ + auVar31._0_4_;
      __x = fVar58 * fVar58 + auVar30._0_4_;
      if (1e-14 < __x) {
        auVar30 = vmulss_avx512f(local_1c8,ZEXT416((uint)fVar60));
        auVar31 = vmulss_avx512f(local_1a8,ZEXT416((uint)fVar43));
        auVar30 = vaddss_avx512f(auVar30,auVar31);
        auVar31 = vmulss_avx512f(local_1c8,ZEXT416((uint)fVar45));
        auVar42 = vmulss_avx512f(local_1a8,ZEXT416((uint)fVar1));
        auVar39 = vmulps_avx512vl(_local_1b8,auVar84);
        auVar40 = vmulps_avx512vl(_local_1f8,auVar85);
        auVar39 = vaddps_avx512vl(auVar39,auVar40);
        auVar40 = vmulps_avx512vl(_local_1b8,local_2a8);
        auVar29 = vmulps_avx512vl(_local_1f8,auVar29);
        auVar57._0_4_ = auVar40._0_4_ + auVar29._0_4_;
        auVar57._4_4_ = auVar40._4_4_ + auVar29._4_4_;
        auVar57._8_4_ = auVar40._8_4_ + auVar29._8_4_;
        auVar57._12_4_ = auVar40._12_4_ + auVar29._12_4_;
        auVar29 = ZEXT816(0) << 0x20;
        _local_1b8 = auVar34;
        local_1a8 = auVar37;
        if (__x < 0.0) {
          local_158._0_4_ = fVar58;
          local_1c8 = auVar28;
          _local_148 = auVar66;
          fVar45 = sqrtf(__x);
          auVar30 = ZEXT416(auVar30._0_4_);
          auVar29 = ZEXT816(0) << 0x40;
          fVar58 = (float)local_158._0_4_;
          auVar28 = local_1c8;
          auVar66 = _local_148;
        }
        else {
          auVar37 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
          fVar45 = auVar37._0_4_;
        }
        auVar34 = vsubps_avx(_local_2d8,_local_2c8);
        auVar39 = vsubps_avx512vl(auVar39,auVar57);
        auVar31 = vsubss_avx512f(auVar30,ZEXT416((uint)(auVar31._0_4_ + auVar42._0_4_)));
        auVar55._4_4_ = fVar45;
        auVar55._0_4_ = fVar45;
        auVar55._8_4_ = fVar45;
        auVar55._12_4_ = fVar45;
        axis.super_Tuple3<pbrt::Vector3,_float>.z = fVar58 / fVar45;
        auVar37 = vshufps_avx(auVar66,auVar66,0xe1);
        auVar37 = vdivps_avx(auVar37,auVar55);
        auVar30 = vmulss_avx512f(auVar41,auVar28);
        auVar42 = vfmadd213ss_avx512f(auVar33,_local_1b8,auVar30);
        auVar30 = vfmsub213ss_avx512f(auVar28,auVar41,auVar30);
        auVar30 = vaddss_avx512f(auVar42,auVar30);
        auVar42 = vfmadd213ss_avx512f(auVar32,local_1a8,auVar30);
        auVar30 = vfnmadd231ss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar42,auVar42);
        auVar30 = vmaxss_avx(auVar30,auVar29);
        if (auVar30._0_4_ < 0.0) {
          local_1c8 = auVar37;
          sinTheta = sqrtf(auVar30._0_4_);
          auVar37 = local_1c8;
        }
        else {
          auVar30 = vsqrtss_avx(auVar30,auVar30);
          sinTheta = auVar30._0_4_;
        }
        axis.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar37._0_8_;
        Rotate((Transform *)&vb,sinTheta,auVar42._0_4_,axis);
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)((float)local_178._0_4_ * vb._4_4_)),
                                  ZEXT416(vb._0_4_),auVar38);
        auVar30 = vfmadd231ss_fma(auVar37,ZEXT416((uint)local_c0),local_198);
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)((float)local_178._0_4_ * local_b4)),
                                  ZEXT416((uint)local_b8),auVar38);
        auVar42 = vfmadd231ss_fma(auVar37,ZEXT416((uint)local_b0),local_198);
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)((float)local_178._0_4_ * local_a4)),
                                  ZEXT416((uint)local_a8),auVar38);
        auVar28 = vfmadd231ss_fma(auVar37,ZEXT416((uint)local_a0),local_198);
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)((float)local_168._0_4_ * vb._4_4_)),auVar35,
                                  ZEXT416(vb._0_4_));
        auVar37 = vfmadd231ss_fma(auVar37,local_188,ZEXT416((uint)local_c0));
        auVar29 = vfmadd231ss_fma(ZEXT416((uint)((float)local_168._0_4_ * local_b4)),auVar35,
                                  ZEXT416((uint)local_b8));
        auVar29 = vfmadd231ss_fma(auVar29,local_188,ZEXT416((uint)local_b0));
        auVar37 = vinsertps_avx(auVar37,auVar29,0x10);
        auVar29 = vfmadd231ss_fma(ZEXT416((uint)((float)local_168._0_4_ * local_a4)),
                                  ZEXT416((uint)local_a8),auVar35);
        auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)local_a0),local_188);
        auVar32 = vfmadd231ss_fma(ZEXT416((uint)((float)local_1b8._0_4_ * auVar42._0_4_)),auVar30,
                                  local_1a8);
        auVar41 = vfmadd231ss_fma(auVar32,auVar28,auVar41);
        fVar45 = auVar41._0_4_;
        auVar30 = vinsertps_avx(ZEXT416((uint)(auVar30._0_4_ - fVar45 * local_1a8._0_4_)),
                                ZEXT416((uint)(auVar42._0_4_ - fVar45 * (float)local_1b8._0_4_)),
                                0x10);
        local_138 = vmovlps_avx(auVar39);
        local_258 = auVar34._0_8_;
        dndvs.super_Tuple3<pbrt::Normal3,_float>.z = auVar31._0_4_;
        dndvs.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)local_138;
        dndvs.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)local_138 >> 0x20);
        dpdus.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar30._0_8_;
        dpdus.super_Tuple3<pbrt::Vector3,_float>.z = auVar28._0_4_ - fVar45 * fVar76;
        ns.super_Tuple3<pbrt::Normal3,_float>._0_8_ = local_1a8._0_8_;
        ns.super_Tuple3<pbrt::Normal3,_float>.z = fVar76;
        dpdvs.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar37._0_8_;
        dpdvs.super_Tuple3<pbrt::Vector3,_float>.z = auVar29._0_4_;
        dndus.super_Tuple3<pbrt::Normal3,_float>.z = fVar44 - fVar67;
        dndus.super_Tuple3<pbrt::Normal3,_float>.x = local_258.x;
        dndus.super_Tuple3<pbrt::Normal3,_float>.y = local_258.y;
        local_130 = auVar31._0_4_;
        SurfaceInteraction::SetShadingGeometry(this,ns,dpdus,dpdvs,dndus,dndvs,true);
      }
    }
  }
  return this;
}

Assistant:

InteractionFromIntersection(const BilinearPatchMesh *mesh,
                                                          int patchIndex, Point2f uv,
                                                          Float time,
                                                          const Vector3f &wo) {
        // Compute bilinear patch intersection point, $\dpdu$, and $\dpdv$
        const int *v = &mesh->vertexIndices[4 * patchIndex];
        Point3f p00 = mesh->p[v[0]], p10 = mesh->p[v[1]], p01 = mesh->p[v[2]],
                p11 = mesh->p[v[3]];
        Point3f pHit = Lerp(uv[0], Lerp(uv[1], p00, p01), Lerp(uv[1], p10, p11));
        Vector3f dpdu = Lerp(uv[1], p10, p11) - Lerp(uv[1], p00, p01);
        Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);

        Point2f uvTex = uv;
        if (mesh->uv != nullptr) {
            // Compute texture coordinates for bilinear patch intersection point
            const Point2f &uv00 = mesh->uv[v[0]], &uv10 = mesh->uv[v[1]];
            const Point2f &uv01 = mesh->uv[v[2]], &uv11 = mesh->uv[v[3]];
            uvTex = Lerp(uv[0], Lerp(uv[1], uv00, uv01), Lerp(uv[1], uv10, uv11));
            // Update bilinear patch $\dpdu$ and $\dpdv$ accounting for texture
            // coordinates Compute partial derivatives of $(u,v)$ with respect to
            // interpolated texture coordinates
            Float dsdu =
                -uv00[0] + uv10[0] + uv[1] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dsdv =
                -uv00[0] + uv01[0] + uv[0] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dtdu =
                -uv00[1] + uv10[1] + uv[1] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float dtdv =
                -uv00[1] + uv01[1] + uv[0] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float duds = std::abs(dsdu) < 1e-8f ? 0 : 1 / dsdu;
            Float dvds = std::abs(dsdv) < 1e-8f ? 0 : 1 / dsdv;
            Float dudt = std::abs(dtdu) < 1e-8f ? 0 : 1 / dtdu;
            Float dvdt = std::abs(dtdv) < 1e-8f ? 0 : 1 / dtdv;

            // Compute partial derivatives of $\pt{}$ with respect to interpolated texture
            // coordinates
            Vector3f dpds = dpdu * duds + dpdv * dvds;
            Vector3f dpdt = dpdu * dudt + dpdv * dvdt;

            // Set _dpdu_ and _dpdt_ to updated partial derivatives
            if (Cross(dpds, dpdt) != Vector3f(0, 0, 0)) {
                if (Dot(Cross(dpdu, dpdv), Cross(dpds, dpdt)) < 0)
                    dpdt = -dpdt;
                CHECK_GE(Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt))),
                         -1e-3);
                dpdu = dpds;
                dpdv = dpdt;
            }
        }
        // Find partial derivatives $\dndu$ and $\dndv$ for bilinear patch
        Vector3f d2Pduu(0, 0, 0), d2Pdvv(0, 0, 0);
        Vector3f d2Pduv(p00.x - p01.x - p10.x + p11.x, p00.y - p01.y - p10.y + p11.y,
                        p00.z - p01.z - p10.z + p11.z);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float EGF2 = DifferenceOfProducts(E, G, F, F);
        Float invEGF2 = (EGF2 == 0) ? Float(0) : 1 / EGF2;
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Initialize bilinear patch intersection point error _pError_
        Vector3f pError =
            gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

        // Initialize _SurfaceInteraction_ for bilinear patch intersection
        int faceIndex = mesh->faceIndices ? mesh->faceIndices[patchIndex] : 0;
        bool flipNormal = mesh->reverseOrientation ^ mesh->transformSwapsHandedness;
        SurfaceInteraction isect(Point3fi(pHit, pError), uvTex, wo, dpdu, dpdv, dndu,
                                 dndv, time, flipNormal, faceIndex);

        if (mesh->n != nullptr) {
            // Compute shading normals for bilinear patch intersection point
            Normal3f n00 = mesh->n[v[0]], n10 = mesh->n[v[1]], n01 = mesh->n[v[2]],
                     n11 = mesh->n[v[3]];
            Normal3f ns = Lerp(uv[0], Lerp(uv[1], n00, n01), Lerp(uv[1], n10, n11));
            if (LengthSquared(ns) > 0) {
                ns = Normalize(ns);
                Normal3f n = Normal3f(Normalize(isect.n));
                Vector3f axis = Cross(Vector3f(n), Vector3f(ns));
                if (LengthSquared(axis) > 1e-14f) {
                    // Set shading geometry for bilinear patch intersection
                    Normal3f dndu = Lerp(uv[1], n10, n11) - Lerp(uv[1], n00, n01);
                    Normal3f dndv = Lerp(uv[0], n01, n11) - Lerp(uv[0], n00, n10);
                    axis = Normalize(axis);
                    Float cosTheta = Dot(n, ns),
                          sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
                    Transform r = Rotate(sinTheta, cosTheta, axis);
                    Vector3f sdpdu = r(dpdu), sdpdv = r(dpdv);
                    sdpdu = GramSchmidt(sdpdu, Vector3f(ns));
                    isect.SetShadingGeometry(ns, sdpdu, sdpdv, dndu, dndv, true);
                }
            }
        }
        return isect;
    }